

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O2

void __thiscall sznet::net::Channel::Channel(Channel *this,EventLoop *loop,sz_fd fd)

{
  undefined1 auVar2 [24];
  undefined1 auVar1 [64];
  
  this->m_loop = loop;
  this->m_fd = fd;
  this->m_events = 0;
  this->m_revents = 0;
  this->m_index = -1;
  this->m_logHup = true;
  (this->m_tie).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->m_tie).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   ((long)&(this->m_tie).super___weak_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi + 7) =
       0;
  auVar1 = ZEXT464(0) << 0x40;
  auVar2 = SUB3224(auVar1._0_32_,0);
  (this->m_readCallback).super__Function_base._M_functor = (_Any_data)auVar2._0_16_;
  (this->m_readCallback).super__Function_base._M_manager = (_Manager_type)auVar2._16_8_;
  (this->m_readCallback)._M_invoker = (_Invoker_type)SUB328(auVar1._0_32_,0x18);
  auVar2 = SUB3224(auVar1._32_32_,0);
  (this->m_writeCallback).super__Function_base._M_functor = (_Any_data)auVar2._0_16_;
  (this->m_writeCallback).super__Function_base._M_manager = (_Manager_type)auVar2._16_8_;
  (this->m_writeCallback)._M_invoker = (_Invoker_type)SUB328(auVar1._32_32_,0x18);
  auVar2 = SUB3224(auVar1._0_32_,0);
  (this->m_closeCallback).super__Function_base._M_functor = (_Any_data)auVar2._0_16_;
  (this->m_closeCallback).super__Function_base._M_manager = (_Manager_type)auVar2._16_8_;
  (this->m_closeCallback)._M_invoker = (_Invoker_type)SUB328(auVar1._0_32_,0x18);
  auVar2 = SUB3224(auVar1._32_32_,0);
  (this->m_errorCallback).super__Function_base._M_functor = (_Any_data)auVar2._0_16_;
  (this->m_errorCallback).super__Function_base._M_manager = (_Manager_type)auVar2._16_8_;
  (this->m_errorCallback)._M_invoker = (_Invoker_type)SUB328(auVar1._32_32_,0x18);
  return;
}

Assistant:

Channel::Channel(EventLoop* loop, sockets::sz_fd fd):
	m_loop(loop),
	m_fd(fd),
	m_events(0),
	m_revents(0),
	m_index(-1),
	m_logHup(true),
	m_tied(false),
	m_eventHandling(false),
	m_addedToLoop(false)
{
}